

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

Maybe<capnp::InterfaceSchema::Method> * __thiscall
capnp::InterfaceSchema::findMethodByName
          (Maybe<capnp::InterfaceSchema::Method> *__return_storage_ptr__,InterfaceSchema *this,
          StringPtr name,uint *counter)

{
  ushort uVar1;
  uint uVar2;
  RawSchema *pRVar3;
  NullableValue<capnp::InterfaceSchema::Method> *pNVar4;
  Fault FVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint64_t id;
  uint uVar10;
  unsigned_long i;
  long lVar11;
  ulong __n;
  bool bVar12;
  Reader RVar13;
  DebugComparison<unsigned_int,_const_unsigned_int_&> _kjCondition;
  int iStack_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  short sStack_d4;
  undefined2 uStack_d2;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined8 uStack_c8;
  Schema local_a8;
  Schema local_a0;
  Reader superclass;
  Fault f;
  ListReader LStack_60;
  
  uVar7 = name.content.size_;
  uVar2 = *counter;
  *counter = uVar2 + 1;
  _kjCondition.left = uVar2;
  _kjCondition.right = &MAX_SUPERCLASSES;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = uVar2 < 0x40;
  if (uVar2 < 0x40) {
    pRVar3 = ((this->super_Schema).raw)->generic;
    getMethods((MethodList *)&f,this);
    uVar2 = pRVar3->memberCount;
    if (uVar2 != 0) {
      uVar10 = 0;
      do {
        FVar5.exception = f.exception;
        uVar1 = *(ushort *)((long)pRVar3->membersByName + (ulong)(uVar2 + uVar10 & 0xfffffffe));
        capnp::_::ListReader::getStructElement
                  ((StructReader *)&_kjCondition.op,&LStack_60,(uint)uVar1);
        _kjCondition._0_8_ = FVar5.exception;
        _kjCondition.right = (uint *)CONCAT62(_kjCondition.right._2_6_,uVar1);
        superclass._reader.data = (void *)CONCAT44(uStack_dc,iStack_e0);
        superclass._reader.pointers._0_4_ = local_d0;
        if (sStack_d4 == 0) {
          superclass._reader.data = (void *)0x0;
          superclass._reader.pointers._0_4_ = 0x7fffffff;
        }
        superclass._reader.segment._0_4_ = 0;
        superclass._reader.segment._4_4_ = 0;
        superclass._reader.capTable._0_4_ = 0;
        superclass._reader.capTable._4_4_ = 0;
        if (sStack_d4 != 0) {
          superclass._reader.segment._0_4_ = _kjCondition.op.content.ptr._0_4_;
          superclass._reader.segment._4_4_ = _kjCondition.op.content.ptr._4_4_;
          superclass._reader.capTable._0_4_ = (undefined4)_kjCondition.op.content.size_;
          superclass._reader.capTable._4_4_ = _kjCondition.op.content.size_._4_4_;
        }
        RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)&superclass,(void *)0x0,0);
        uVar8 = RVar13.super_StringPtr.content.size_;
        if ((uVar8 == uVar7) &&
           ((uVar7 == 0 ||
            (iVar6 = bcmp(RVar13.super_StringPtr.content.ptr,name.content.ptr,uVar7), iVar6 == 0))))
        {
          (__return_storage_ptr__->ptr).isSet = true;
          (__return_storage_ptr__->ptr).field_1.value.parent.super_Schema.raw =
               (RawBrandedSchema *)_kjCondition._0_8_;
          *(uint **)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = _kjCondition.right;
          (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment =
               (SegmentReader *)_kjCondition.op.content.ptr;
          (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable =
               (CapTableReader *)_kjCondition.op.content.size_;
          (__return_storage_ptr__->ptr).field_1.value.proto._reader.data =
               (void *)CONCAT26(_kjCondition._38_2_,
                                CONCAT24(_kjCondition._36_2_,_kjCondition._32_4_));
          (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers =
               (WirePointer *)CONCAT44(uStack_dc,iStack_e0);
          pNVar4 = &__return_storage_ptr__->ptr;
          *(undefined4 *)((long)&pNVar4->field_1 + 0x30) = uStack_d8;
          *(short *)((long)&pNVar4->field_1 + 0x34) = sStack_d4;
          *(undefined2 *)((long)&pNVar4->field_1 + 0x36) = uStack_d2;
          *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.proto._reader.nestingLimit =
               CONCAT44(uStack_cc,local_d0);
          return __return_storage_ptr__;
        }
        uVar9 = uVar2 + uVar10 >> 1;
        __n = uVar8;
        if (uVar8 >= uVar7) {
          __n = uVar7;
        }
        iVar6 = memcmp(RVar13.super_StringPtr.content.ptr,name.content.ptr,__n);
        bVar12 = iVar6 < 0;
        if (iVar6 == 0) {
          bVar12 = uVar8 < uVar7;
        }
        if (bVar12) {
          uVar10 = uVar9 + 1;
          uVar9 = uVar2;
        }
        uVar2 = uVar9;
      } while (uVar10 < uVar2);
    }
    (__return_storage_ptr__->ptr).isSet = false;
    LStack_60.capTable = (CapTableReader *)((this->super_Schema).raw)->generic->encodedNode;
    f.exception = (Exception *)0x0;
    LStack_60.segment = (SegmentReader *)0x0;
    LStack_60.ptr._0_4_ = 0x7fffffff;
    capnp::_::PointerReader::getStruct
              ((StructReader *)&_kjCondition,(PointerReader *)&f,(word *)0x0);
    superclass._reader.data = (void *)(_kjCondition.op.content.size_ + 0x20);
    if ((ushort)_kjCondition._36_2_ < 5) {
      superclass._reader.segment._0_4_ = 0;
      superclass._reader.segment._4_4_ = 0;
      superclass._reader.capTable._0_4_ = 0;
      superclass._reader.capTable._4_4_ = 0;
      superclass._reader.pointers._0_4_ = 0x7fffffff;
      superclass._reader.data = (void *)0x0;
    }
    else {
      superclass._reader.segment._0_4_ = _kjCondition.left;
      superclass._reader.segment._4_4_ = _kjCondition._4_4_;
      superclass._reader.capTable._0_4_ = _kjCondition.right._0_4_;
      superclass._reader.capTable._4_4_ = _kjCondition.right._4_4_;
      superclass._reader.pointers._0_4_ = iStack_e0;
    }
    capnp::_::PointerReader::getList
              ((ListReader *)&f,(PointerReader *)&superclass,INLINE_COMPOSITE,(word *)0x0);
    uVar7 = (ulong)(uint)LStack_60.ptr;
    if (uVar7 != 0) {
      lVar11 = 0;
      do {
        capnp::_::ListReader::getStructElement
                  (&superclass._reader,(ListReader *)&f,(ElementCount)lVar11);
        if (superclass._reader.dataSize < 0x40) {
          id = 0;
        }
        else {
          id = *superclass._reader.data;
        }
        local_a8 = Schema::getDependency(&this->super_Schema,id,(ElementCount)lVar11 | 0x4000000);
        local_a0.raw = (RawBrandedSchema *)Schema::asInterface(&local_a8);
        findMethodByName((Maybe<capnp::InterfaceSchema::Method> *)&_kjCondition,
                         (InterfaceSchema *)&local_a0,name,counter);
        if ((StructReader *)&_kjCondition != (StructReader *)__return_storage_ptr__) {
          if ((__return_storage_ptr__->ptr).isSet == true) {
            (__return_storage_ptr__->ptr).isSet = false;
          }
          if ((char)_kjCondition.left == '\x01') {
            pNVar4 = &__return_storage_ptr__->ptr;
            *(undefined4 *)((long)&pNVar4->field_1 + 0x30) = local_d0;
            *(short *)((long)&pNVar4->field_1 + 0x34) = (short)uStack_cc;
            *(short *)((long)&pNVar4->field_1 + 0x36) = (short)((uint)uStack_cc >> 0x10);
            *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.proto._reader.nestingLimit =
                 uStack_c8;
            (__return_storage_ptr__->ptr).field_1.value.proto._reader.data =
                 (void *)CONCAT44(uStack_dc,iStack_e0);
            (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers =
                 (WirePointer *)CONCAT26(uStack_d2,CONCAT24(sStack_d4,uStack_d8));
            (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment =
                 (SegmentReader *)_kjCondition.op.content.size_;
            (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable =
                 (CapTableReader *)
                 CONCAT26(_kjCondition._38_2_,CONCAT24(_kjCondition._36_2_,_kjCondition._32_4_));
            (__return_storage_ptr__->ptr).field_1.value.parent.super_Schema.raw =
                 (RawBrandedSchema *)_kjCondition.right;
            *(char **)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
                 _kjCondition.op.content.ptr;
            (__return_storage_ptr__->ptr).isSet = true;
          }
        }
      } while (((__return_storage_ptr__->ptr).isSet == false) &&
              (bVar12 = uVar7 - 1 != lVar11, lVar11 = lVar11 + 1, bVar12));
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int_const&>&,char_const(&)[53]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x24a,FAILED,"counter++ < MAX_SUPERCLASSES",
               "_kjCondition,\"Cyclic or absurdly-large inheritance graph detected.\"",&_kjCondition
               ,(char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    (__return_storage_ptr__->ptr).isSet = false;
    kj::_::Debug::Fault::~Fault(&f);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<InterfaceSchema::Method> InterfaceSchema::findMethodByName(
    kj::StringPtr name, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return kj::none;
  }

  auto result = findSchemaMemberByName(raw->generic, name, getMethods());

  if (result == kj::none) {
    // Search superclasses.
    // TODO(perf):  This may be somewhat slow, and in the case of lots of diamond dependencies it
    //   could get pathological.  Arguably we should generate a flat list of transitive
    //   superclasses to search and store it in the RawSchema.  It's problematic, though, because
    //   this means that a dynamically-loaded RawSchema cannot be correctly constructed until all
    //   superclasses have been loaded, which imposes an ordering requirement on SchemaLoader or
    //   requires updating subclasses whenever a new superclass is loaded.
    auto superclasses = getProto().getInterface().getSuperclasses();
    for (auto i: kj::indices(superclasses)) {
      auto superclass = superclasses[i];
      uint location = _::RawBrandedSchema::makeDepLocation(
          _::RawBrandedSchema::DepKind::SUPERCLASS, i);
      result = getDependency(superclass.getId(), location)
          .asInterface().findMethodByName(name, counter);
      if (result != kj::none) {
        break;
      }
    }
  }

  return result;
}